

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O3

int32 bio_writehdr_version(FILE *fp,char *version)

{
  uint32 b;
  undefined1 local_14 [4];
  
  fwrite("s3\n",3,1,(FILE *)fp);
  fprintf((FILE *)fp,"version %s\n",version);
  fwrite("endhdr\n",7,1,(FILE *)fp);
  fflush((FILE *)fp);
  fwrite(local_14,4,1,(FILE *)fp);
  fflush((FILE *)fp);
  return 0;
}

Assistant:

int32
bio_writehdr_version(FILE * fp, char *version)
{
    uint32 b;

    fprintf(fp, "s3\n");
    fprintf(fp, "version %s\n", version);
    fprintf(fp, "endhdr\n");
    fflush(fp);

    b = (uint32) BYTE_ORDER_MAGIC;
    fwrite(&b, sizeof(uint32), 1, fp);
    fflush(fp);

    return 0;
}